

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  int iVar1;
  int iVar2;
  ImFontAtlasCustomRect *pIVar3;
  ImFont **ppIVar4;
  ImFontGlyph *pIVar5;
  ImFontAtlas *in_RDI;
  bool bVar6;
  ImFont *unaff_retaddr;
  float in_stack_00000010;
  int j;
  ImWchar ellipsis_variants [2];
  ImFont *font;
  int i_2;
  int i_1;
  ImVec2 uv1;
  ImVec2 uv0;
  ImFontAtlasCustomRect *r;
  int i;
  int in_stack_ffffffffffffffac;
  ImVector<ImFontAtlasCustomRect> *in_stack_ffffffffffffffb0;
  int local_40;
  ImWchar local_3c [2];
  ImVec2 *in_stack_ffffffffffffffc8;
  ImFont *this;
  undefined4 in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  int iVar7;
  float in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  float in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe4;
  float in_stack_fffffffffffffff0;
  
  bVar6 = true;
  if (in_RDI->TexPixelsAlpha8 == (uchar *)0x0) {
    bVar6 = in_RDI->TexPixelsRGBA32 != (uint *)0x0;
  }
  if (!bVar6) {
    __assert_fail("atlas->TexPixelsAlpha8 != __null || atlas->TexPixelsRGBA32 != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0xa1d,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
  }
  ImFontAtlasBuildRenderDefaultTexData
            ((ImFontAtlas *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  ImFontAtlasBuildRenderLinesTexData((ImFontAtlas *)r);
  for (iVar1 = 0; iVar1 < (in_RDI->CustomRects).Size; iVar1 = iVar1 + 1) {
    pIVar3 = ImVector<ImFontAtlasCustomRect>::operator[]
                       (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    if ((pIVar3->Font != (ImFont *)0x0) && (pIVar3->GlyphID != 0)) {
      if (pIVar3->Font->ContainerAtlas != in_RDI) {
        __assert_fail("r->Font->ContainerAtlas == atlas",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                      ,0xa29,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
      }
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe0);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd8);
      ImFontAtlas::CalcCustomRectUV
                ((ImFontAtlas *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 (ImFontAtlasCustomRect *)
                 CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 (ImVec2 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
      ImFont::AddGlyph(unaff_retaddr,(ImFontConfig *)in_RDI,(ImWchar)((uint)iVar1 >> 0x10),
                       in_stack_fffffffffffffff0,(float)((ulong)pIVar3 >> 0x20),SUB84(pIVar3,0),
                       in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc
                       ,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_00000010);
    }
  }
  for (iVar7 = 0; iVar7 < (in_RDI->Fonts).Size; iVar7 = iVar7 + 1) {
    ppIVar4 = ImVector<ImFont_*>::operator[]
                        ((ImVector<ImFont_*> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    if (((*ppIVar4)->DirtyLookupTables & 1U) != 0) {
      ImVector<ImFont_*>::operator[]
                ((ImVector<ImFont_*> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      ImFont::BuildLookupTable
                ((ImFont *)
                 CONCAT26((short)((uint)iVar1 >> 0x10),
                          CONCAT24((short)iVar1,in_stack_fffffffffffffff0)));
    }
  }
  iVar1 = 0;
  do {
    iVar7 = iVar1;
    iVar2 = ImVector<ImFont_*>::size(&in_RDI->Fonts);
    if (iVar2 <= iVar1) {
      return;
    }
    ppIVar4 = ImVector<ImFont_*>::operator[]
                        ((ImVector<ImFont_*> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    this = *ppIVar4;
    if (this->EllipsisChar == 0xffff) {
      local_3c[0] = 0x2026;
      local_3c[1] = 0x85;
      for (local_40 = 0; local_40 < 2; local_40 = local_40 + 1) {
        pIVar5 = ImFont::FindGlyphNoFallback(this,local_3c[local_40]);
        if (pIVar5 != (ImFontGlyph *)0x0) {
          this->EllipsisChar = local_3c[local_40];
          break;
        }
      }
    }
    iVar1 = iVar7 + 1;
  } while( true );
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Also note that 0x2026 is currently seldom included in our font ranges. Because of this we are more likely to use three individual dots.
    for (int i = 0; i < atlas->Fonts.size(); i++)
    {
        ImFont* font = atlas->Fonts[i];
        if (font->EllipsisChar != (ImWchar)-1)
            continue;
        const ImWchar ellipsis_variants[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
        for (int j = 0; j < IM_ARRAYSIZE(ellipsis_variants); j++)
            if (font->FindGlyphNoFallback(ellipsis_variants[j]) != NULL) // Verify glyph exists
            {
                font->EllipsisChar = ellipsis_variants[j];
                break;
            }
    }
}